

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall mognetwork::Socket::create(Socket *this,SocketFD fd)

{
  SocketFD SVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 in_ESI;
  long in_RDI;
  int yes_1;
  int yes;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  iVar2 = *(int *)(in_RDI + 0xc);
  local_c = in_ESI;
  SVar1 = OsSocket::notValid();
  if (iVar2 == SVar1) {
    *(undefined4 *)(in_RDI + 0xc) = local_c;
    if (*(int *)(in_RDI + 8) == 0) {
      local_10 = 1;
      iVar2 = setsockopt(*(int *)(in_RDI + 0xc),6,1,&local_10,4);
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot set option \"TCP_NODELAY\" on the sockets.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      local_14 = 1;
      iVar2 = setsockopt(*(int *)(in_RDI + 0xc),1,6,&local_14,4);
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to enable broadcast on UDP socket.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void Socket::create(SocketFD fd)
  {
    if (m_socket == mognetwork::OsSocket::notValid())
      {
	m_socket = fd;
	if (m_type == Tcp)
	  {
	    int yes = 1;
	    if (setsockopt(m_socket, IPPROTO_TCP, TCP_NODELAY, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Cannot set option \"TCP_NODELAY\" on the sockets." << std::endl;
	      }

#ifdef OS_MAC
	    if (setsockopt(m_socket, SOL_SOCKET, SO_NOSIGPIPE, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Cannot set option \"SO_NOSIGPIPE\" on the socket." << std::endl;
	      }
#endif // OS_MAC
	  }
	else
	  {
	    int yes = 1;
	    if (setsockopt(m_socket, SOL_SOCKET, SO_BROADCAST, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Failed to enable broadcast on UDP socket." << std::endl;
	      }
	  }
      }
  }